

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall
QList<QVariant_(*)(const_void_*,_const_void_*,_double)>::resize
          (QList<QVariant_(*)(const_void_*,_const_void_*,_double)> *this,qsizetype size)

{
  resize_internal(this,size);
  if ((this->d).size < size) {
    QArrayDataPointer<QVariant_(*)(const_void_*,_const_void_*,_double)>::appendInitialize
              (&this->d,size);
    return;
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }